

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

LY_ERR parse_identity(lysp_yang_ctx *ctx,lysp_ident **identities)

{
  lysp_ext_instance **exts;
  lysp_ident *plVar1;
  lyd_node *plVar2;
  LY_ERR LVar3;
  long *plVar4;
  long lVar5;
  char *pcVar6;
  uint16_t *puVar7;
  lyd_node **word_len_00;
  char *format;
  ly_ctx *plVar8;
  ly_stmt lVar9;
  void *parent;
  lysp_ext_instance **exts_00;
  char **str_p;
  uint16_t *puVar10;
  bool bVar11;
  lysp_ext_instance **in_stack_ffffffffffffff80;
  ly_stmt kw;
  char *word;
  size_t word_len;
  uint16_t *local_60;
  lysp_qname **local_58;
  uint16_t *local_50;
  uint16_t *local_48;
  char **local_40;
  char *buf;
  
  plVar1 = *identities;
  if (plVar1 == (lysp_ident *)0x0) {
    plVar4 = (long *)malloc(0x40);
    if (plVar4 == (long *)0x0) goto LAB_001756e3;
    *plVar4 = 1;
    lVar5 = 1;
  }
  else {
    lVar5 = *(long *)&plVar1[-1].flags;
    *(long *)&plVar1[-1].flags = lVar5 + 1;
    plVar4 = (long *)realloc(&plVar1[-1].flags,lVar5 * 0x38 + 0x40);
    if (plVar4 == (long *)0x0) {
      *(long *)&(*identities)[-1].flags = *(long *)&(*identities)[-1].flags + -1;
LAB_001756e3:
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(plVar8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_identity");
      return LY_EMEM;
    }
    lVar5 = *plVar4;
  }
  *identities = (lysp_ident *)(plVar4 + 1);
  plVar4[lVar5 * 7 + -2] = 0;
  (plVar4 + lVar5 * 7 + -2)[1] = 0;
  plVar4[lVar5 * 7 + -4] = 0;
  (plVar4 + lVar5 * 7 + -4)[1] = 0;
  plVar4[lVar5 * 7 + -6] = 0;
  (plVar4 + lVar5 * 7 + -6)[1] = 0;
  plVar4[lVar5 * 7] = 0;
  exts_00 = (lysp_ext_instance **)&buf;
  LVar3 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&word,(char **)exts_00,&word_len);
  if (LVar3 == LY_SUCCESS) {
    str_p = (char **)(plVar4 + lVar5 * 7 + -6);
    if (buf == (char *)0x0) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar6 = word;
      if (word_len == 0) {
        pcVar6 = "";
      }
      LVar3 = lydict_insert(plVar8,pcVar6,word_len,str_p);
    }
    else {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar3 = lydict_insert_zc(plVar8,word,str_p);
    }
    if (LVar3 == LY_SUCCESS) {
      word_len_00 = (lyd_node **)&word_len;
      LVar3 = get_keyword(ctx,&kw,&word,(size_t *)word_len_00);
      if (LVar3 == LY_SUCCESS) {
        local_40 = str_p;
        if (kw == LY_STMT_SYNTAX_SEMICOLON) {
          bVar11 = false;
        }
        else {
          if (kw != LY_STMT_SYNTAX_LEFT_BRACE) {
            if (ctx == (lysp_yang_ctx *)0x0) {
              plVar8 = (ly_ctx *)0x0;
            }
            else {
              plVar8 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            pcVar6 = lyplg_ext_stmt2str(kw);
            ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar6);
            return LY_EVALID;
          }
          word_len_00 = (lyd_node **)&word_len;
          LVar3 = get_keyword(ctx,&kw,&word,(size_t *)word_len_00);
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          bVar11 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
        }
        local_48 = (uint16_t *)(plVar4 + lVar5 * 7);
        exts = (lysp_ext_instance **)(local_48 + -4);
        local_60 = local_48 + -0x10;
        local_50 = local_48 + -8;
        local_58 = (lysp_qname **)(local_48 + -0x14);
        puVar10 = local_48 + -0xc;
        lVar9 = kw;
        do {
          do {
            if (!bVar11) {
              return LY_SUCCESS;
            }
            if (lVar9 == LY_STMT_BASE) {
              if (*(long *)local_60 != 0) {
                word_len_00 = (ctx->parsed_mods->field_2).dnodes;
                if (*(byte *)&word_len_00[ctx->parsed_mods->count - 1][2].schema < 2) {
                  ly_vlog((ly_ctx *)**(undefined8 **)word_len_00[ctx->parsed_mods->count - 1],
                          (char *)0x0,LYVE_SYNTAX_YANG,
                          "Identity can be derived from multiple base identities only in YANG 1.1 modules"
                         );
                  return LY_EVALID;
                }
              }
              LVar3 = parse_text_fields(ctx,(ly_stmt)local_60,(char ***)exts,(yang_arg)word_len_00,
                                        exts_00);
            }
            else if (lVar9 == LY_STMT_STATUS) {
              LVar3 = parse_status(ctx,local_48,exts);
            }
            else if (lVar9 == LY_STMT_EXTENSION_INSTANCE) {
              exts_00 = (lysp_ext_instance **)0x120000;
              LVar3 = parse_ext(ctx,word,word_len,local_40,LY_STMT_IDENTITY,0,exts);
            }
            else if (lVar9 == LY_STMT_IF_FEATURE) {
              plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              if (*(byte *)&plVar2[2].schema < 2) {
                plVar8 = (ly_ctx *)**(undefined8 **)plVar2;
                format = 
                "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                ;
                pcVar6 = "if-feature";
LAB_00175a84:
                ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar6,"identity");
                return LY_EVALID;
              }
              LVar3 = parse_qnames(ctx,LY_STMT_IF_FEATURE,local_58,(yang_arg)exts,exts_00);
            }
            else {
              if (lVar9 == LY_STMT_REFERENCE) {
                parent = *(void **)local_50;
                lVar9 = LY_STMT_REFERENCE;
                puVar7 = local_50;
              }
              else {
                if (lVar9 != LY_STMT_DESCRIPTION) {
                  if (ctx == (lysp_yang_ctx *)0x0) {
                    plVar8 = (ly_ctx *)0x0;
                  }
                  else {
                    plVar8 = (ly_ctx *)
                             **(undefined8 **)
                               (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                  }
                  pcVar6 = lyplg_ext_stmt2str(lVar9);
                  format = "Invalid keyword \"%s\" as a child of \"%s\".";
                  goto LAB_00175a84;
                }
                parent = *(void **)puVar10;
                lVar9 = LY_STMT_DESCRIPTION;
                puVar7 = puVar10;
              }
              exts_00 = (lysp_ext_instance **)0x2;
              LVar3 = parse_text_field(ctx,parent,lVar9,(uint32_t)puVar7,(char **)0x2,Y_IDENTIF_ARG,
                                       (uint16_t *)exts,in_stack_ffffffffffffff80);
            }
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
            word_len_00 = (lyd_node **)&word_len;
            LVar3 = get_keyword(ctx,&kw,&word,(size_t *)word_len_00);
            lVar9 = kw;
            if (LVar3 != LY_SUCCESS) {
              return LVar3;
            }
            bVar11 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
          } while ((bVar11) || (*exts == (lysp_ext_instance *)0x0));
          word_len_00 = (lyd_node **)0x0;
          LVar3 = ly_set_add(&ctx->main_ctx->ext_inst,*exts,'\x01',(uint32_t *)0x0);
        } while (LVar3 == LY_SUCCESS);
      }
    }
  }
  return LVar3;
}

Assistant:

LY_ERR
parse_identity(struct lysp_yang_ctx *ctx, struct lysp_ident **identities)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_ident *ident;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *identities, ident, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, ident->name, word, word_len, ret, cleanup);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, ident->dsc, LY_STMT_DESCRIPTION, 0, &ident->dsc, Y_STR_ARG, NULL, &ident->exts));
            break;
        case LY_STMT_IF_FEATURE:
            PARSER_CHECK_STMTVER2_RET(ctx, "if-feature", "identity");
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &ident->iffeatures, Y_STR_ARG, &ident->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, ident->ref, LY_STMT_REFERENCE, 0, &ident->ref, Y_STR_ARG, NULL, &ident->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &ident->flags, &ident->exts));
            break;
        case LY_STMT_BASE:
            if (ident->bases && (PARSER_CUR_PMOD(ctx)->version < LYS_VERSION_1_1)) {
                LOGVAL_PARSER(ctx, LYVE_SYNTAX_YANG,
                        "Identity can be derived from multiple base identities only in YANG 1.1 modules");
                return LY_EVALID;
            }
            LY_CHECK_RET(parse_text_fields(ctx, LY_STMT_BASE, &ident->bases, Y_PREF_IDENTIF_ARG, &ident->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, ident, LY_STMT_IDENTITY, 0, &ident->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "identity");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, ident->exts, ret, cleanup);
    }

cleanup:
    return ret;
}